

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontroller.cpp
# Opt level: O3

void __thiscall IGameController::EvaluateSpawnType(IGameController *this,CSpawnEval *pEval,int Type)

{
  vec2 *pvVar1;
  float fVar2;
  CEntity *pCVar3;
  vec2 Pos;
  vec2 vVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long in_FS_OFFSET;
  uint uVar12;
  uint uVar13;
  float fVar14;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar15;
  float fVar16;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar17;
  float fVar18;
  float fVar19;
  CCharacter *aEnts [64];
  float local_268 [12];
  CEntity *local_238 [64];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < this->m_aNumSpawnPoints[Type]) {
    lVar11 = 0;
    do {
      pvVar1 = this->m_aaSpawnPoints[Type] + lVar11;
      uVar6 = CGameWorld::FindEntities(&this->m_pGameServer->m_World,*pvVar1,64.0,local_238,0x40,3);
      local_268[0] = 0.0;
      local_268[1] = 0.0;
      local_268[2] = -32.0;
      local_268[3] = 0.0;
      local_268[4] = 0.0;
      local_268[5] = -32.0;
      local_268[6] = 32.0;
      local_268[7] = 0.0;
      local_268[8] = 0.0;
      local_268[9] = 32.0;
      uVar10 = 0;
      do {
        iVar8 = (int)uVar10;
        if ((int)uVar6 < 1) goto LAB_00120869;
        fVar16 = local_268[uVar10 * 2];
        fVar2 = local_268[uVar10 * 2 + 1];
        fVar14 = (pvVar1->field_1).y;
        uVar9 = 0;
        while( true ) {
          fVar18 = (pvVar1->field_0).x + fVar16;
          fVar14 = fVar14 + fVar2;
          uVar12 = -(uint)(0.0 < fVar18);
          uVar13 = -(uint)(0.0 < fVar14);
          bVar5 = CCollision::IsTile(&this->m_pGameServer->m_Collision,
                                     (int)((float)(~uVar12 & 0xbf000000 | uVar12 & 0x3f000000) +
                                          fVar18),
                                     (int)((float)(~uVar13 & 0xbf000000 | uVar13 & 0x3f000000) +
                                          fVar14),1);
          iVar7 = -1;
          if (bVar5) break;
          pCVar3 = local_238[uVar9];
          fVar14 = (pvVar1->field_1).y;
          fVar19 = (pCVar3->m_Pos).field_0.x - ((pvVar1->field_0).x + fVar16);
          fVar18 = (pCVar3->m_Pos).field_1.y - (fVar2 + fVar14);
          if ((SQRT(fVar19 * fVar19 + fVar18 * fVar18) <= pCVar3->m_ProximityRadius) ||
             (uVar9 = uVar9 + 1, iVar7 = iVar8, uVar6 == uVar9)) break;
        }
        iVar8 = iVar7;
      } while ((uVar10 < 4) && (uVar10 = uVar10 + 1, iVar8 == -1));
      if (iVar8 != -1) {
LAB_00120869:
        aVar15.x = (float)*(undefined8 *)(local_268 + (long)iVar8 * 2) + (*pvVar1).field_0.x;
        aVar17.y = (float)((ulong)*(undefined8 *)(local_268 + (long)iVar8 * 2) >> 0x20) +
                   (*pvVar1).field_1.y;
        vVar4.field_1.y = aVar17.y;
        vVar4.field_0.x = aVar15.x;
        if (pEval->m_RandomSpawn == true) {
          iVar7 = rand();
          fVar16 = (float)iVar7 * 4.656613e-10 + (float)iVar8;
        }
        else {
          Pos.field_1.y = aVar17.y;
          Pos.field_0.x = aVar15.x;
          fVar16 = EvaluateSpawnPos(this,pEval,Pos);
        }
        if ((pEval->m_Got != true) || (fVar16 < pEval->m_Score)) {
          pEval->m_Got = true;
          pEval->m_Score = fVar16;
          pEval->m_Pos = vVar4;
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->m_aNumSpawnPoints[Type]);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void IGameController::EvaluateSpawnType(CSpawnEval *pEval, int Type) const
{
	// get spawn point
	for(int i = 0; i < m_aNumSpawnPoints[Type]; i++)
	{
		// check if the position is occupado
		CCharacter *aEnts[MAX_CLIENTS];
		int Num = GameServer()->m_World.FindEntities(m_aaSpawnPoints[Type][i], 64, (CEntity**)aEnts, MAX_CLIENTS, CGameWorld::ENTTYPE_CHARACTER);
		vec2 Positions[5] = { vec2(0.0f, 0.0f), vec2(-32.0f, 0.0f), vec2(0.0f, -32.0f), vec2(32.0f, 0.0f), vec2(0.0f, 32.0f) };	// start, left, up, right, down
		int Result = -1;
		for(int Index = 0; Index < 5 && Result == -1; ++Index)
		{
			Result = Index;
			for(int c = 0; c < Num; ++c)
				if(GameServer()->Collision()->CheckPoint(m_aaSpawnPoints[Type][i]+Positions[Index]) ||
					distance(aEnts[c]->GetPos(), m_aaSpawnPoints[Type][i]+Positions[Index]) <= aEnts[c]->GetProximityRadius())
				{
					Result = -1;
					break;
				}
		}
		if(Result == -1)
			continue;	// try next spawn point

		vec2 P = m_aaSpawnPoints[Type][i]+Positions[Result];
		float S = pEval->m_RandomSpawn ? (Result + random_float()) : EvaluateSpawnPos(pEval, P);
		if(!pEval->m_Got || pEval->m_Score > S)
		{
			pEval->m_Got = true;
			pEval->m_Score = S;
			pEval->m_Pos = P;
		}
	}
}